

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

void addfield(lua_State *L,luaL_Buffer *b,lua_Integer i)

{
  int iVar1;
  char *pcVar2;
  
  lua_geti(L,1,i);
  iVar1 = lua_isstring(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,-1);
    pcVar2 = lua_typename(L,iVar1);
    luaL_error(L,"invalid value (%s) at index %d in table for \'concat\'",pcVar2,i);
  }
  luaL_addvalue(b);
  return;
}

Assistant:

static void addfield (lua_State *L, luaL_Buffer *b, lua_Integer i) {
  lua_geti(L, 1, i);
  if (!lua_isstring(L, -1))
    luaL_error(L, "invalid value (%s) at index %d in table for 'concat'",
                  luaL_typename(L, -1), i);
  luaL_addvalue(b);
}